

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_inet.cc
# Opt level: O3

size_t __thiscall
CSocekt::flyd_sock_ntop(CSocekt *this,sockaddr *sa,int port,u_char *text,size_t len)

{
  char *pcVar1;
  self *psVar2;
  LogStream *pLVar3;
  SourceFile file;
  SourceFile file_00;
  Logger LStack_ff8;
  
  if (sa->sa_family != 2) {
    return 0;
  }
  pcVar1 = sa->sa_data + 2;
  if (port == 0) {
    if (2 < muduo::g_logLevel) goto LAB_00114c80;
    file_00._8_8_ = 0x13;
    file_00.data_ = "flyd_socket_inet.cc";
    muduo::Logger::Logger(&LStack_ff8,file_00,0x31);
    psVar2 = muduo::LogStream::operator<<(&LStack_ff8.impl_.stream_,(char *)text);
    pLVar3 = muduo::LogStream::operator<<(psVar2,len);
    pLVar3 = muduo::LogStream::operator<<(pLVar3,(uint)(byte)*pcVar1);
    pLVar3 = muduo::LogStream::operator<<(pLVar3,(uint)(byte)sa->sa_data[3]);
    pLVar3 = muduo::LogStream::operator<<(pLVar3,(uint)(byte)sa->sa_data[4]);
    muduo::LogStream::operator<<(pLVar3,(uint)(byte)sa->sa_data[5]);
  }
  else {
    if (2 < muduo::g_logLevel) goto LAB_00114c80;
    file._8_8_ = 0x13;
    file.data_ = "flyd_socket_inet.cc";
    muduo::Logger::Logger(&LStack_ff8,file,0x2c);
    psVar2 = muduo::LogStream::operator<<(&LStack_ff8.impl_.stream_,(char *)text);
    pLVar3 = muduo::LogStream::operator<<(psVar2,len);
    pLVar3 = muduo::LogStream::operator<<(pLVar3,(uint)(byte)*pcVar1);
    pLVar3 = muduo::LogStream::operator<<(pLVar3,(uint)(byte)sa->sa_data[3]);
    pLVar3 = muduo::LogStream::operator<<(pLVar3,(uint)(byte)sa->sa_data[4]);
    pLVar3 = muduo::LogStream::operator<<(pLVar3,(uint)(byte)sa->sa_data[5]);
    muduo::LogStream::operator<<(pLVar3,*(ushort *)sa->sa_data << 8 | *(ushort *)sa->sa_data >> 8);
  }
  muduo::Logger::~Logger(&LStack_ff8);
LAB_00114c80:
  return (long)pcVar1 - (long)text;
}

Assistant:

size_t CSocekt::flyd_sock_ntop(struct sockaddr *sa,int port,u_char *text,size_t len)
{
    struct sockaddr_in   *sin;
    u_char               *p;

    switch (sa->sa_family)
    {
        case AF_INET:
            sin = (struct sockaddr_in *) sa;
            p = (u_char *) &sin->sin_addr;
            if(port)  //端口信息也组合到字符串里
            {
                LOG_INFO << text << len << p[0] << p[1] << p[2] << p[3] << ntohs(sin->sin_port);
                //p = ngx_snprintf(text, len, "%ud.%ud.%ud.%ud:%d",p[0], p[1], p[2], p[3], ntohs(sin->sin_port)); //返回的是新的可写地址
            }
            else //不需要组合端口信息到字符串中
            {
                LOG_INFO << text << len << p[0] << p[1] << p[2] << p[3] ;
               // p = ngx_snprintf(text, len, "%ud.%ud.%ud.%ud",p[0], p[1], p[2], p[3]);
            }
            return (p - text);
            break;
        default:
            return 0;
            break;
    }
    return 0;
}